

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::
ImmutablePrimitiveOneofFieldGenerator
          (ImmutablePrimitiveOneofFieldGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  OneofDescriptor *oneof;
  OneofGeneratorInfo *info_00;
  OneofGeneratorInfo *info;
  Context *context_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  ImmutablePrimitiveOneofFieldGenerator *this_local;
  
  ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
            (&this->super_ImmutablePrimitiveFieldGenerator,descriptor,messageBitIndex,
             builderBitIndex,context);
  (this->super_ImmutablePrimitiveFieldGenerator).super_ImmutableFieldGenerator.
  _vptr_ImmutableFieldGenerator = (_func_int **)&PTR__ImmutablePrimitiveOneofFieldGenerator_008e85a0
  ;
  oneof = FieldDescriptor::containing_oneof(descriptor);
  info_00 = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info_00,&(this->super_ImmutablePrimitiveFieldGenerator).variables_);
  return;
}

Assistant:

ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : ImmutablePrimitiveFieldGenerator(descriptor, messageBitIndex,
                                       builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}